

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O3

void __thiscall xray_re::xr_ogf_v3::bone_io::import_ikdata_0(bone_io *this,xr_reader *r)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  float *pfVar3;
  long lVar4;
  uint32_t *puVar5;
  s_bone_shape *psVar6;
  s_joint_ik_data *psVar7;
  byte bVar8;
  
  bVar8 = 0;
  xr_reader::r_sz(r,&(this->super_xr_bone).m_gamemtl);
  puVar5 = (r->field_2).m_p_u32;
  psVar6 = &(this->super_xr_bone).m_shape;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar1 = *puVar5;
    psVar6->type = (short)uVar1;
    psVar6->flags = (short)(uVar1 >> 0x10);
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    psVar6 = (s_bone_shape *)((long)psVar6 + (ulong)bVar8 * -8 + 4);
  }
  puVar2 = (r->field_2).m_p;
  (r->field_2).m_p_u32 = (uint32_t *)(puVar2 + 0x70);
  puVar5 = (uint32_t *)(puVar2 + 0x70);
  psVar7 = &(this->super_xr_bone).m_joint_ik_data;
  for (lVar4 = 0x13; lVar4 != 0; lVar4 = lVar4 + -1) {
    psVar7->type = *puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    psVar7 = (s_joint_ik_data *)((long)psVar7 + (ulong)bVar8 * -8 + 4);
  }
  (r->field_2).m_p = (r->field_2).m_p + 0x4c;
  (this->super_xr_bone).m_joint_ik_data.ik_flags = 0;
  (this->super_xr_bone).m_joint_ik_data.break_force = 0.0;
  (this->super_xr_bone).m_joint_ik_data.break_torque = 0.0;
  (this->super_xr_bone).m_joint_ik_data.friction = 0.0;
  puVar2 = (r->field_2).m_p;
  (r->field_2).m_p = puVar2 + -0x10;
  if (puVar2 + -0x10 <= r->m_end) {
    (r->field_2).m_p = puVar2 + -0xc;
    (this->super_xr_bone).m_bind_rotate.field_0.field_0.x = *(float *)(puVar2 + -0x10);
    pfVar3 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
    (this->super_xr_bone).m_bind_rotate.field_0.field_0.y = *pfVar3;
    pfVar3 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
    (this->super_xr_bone).m_bind_rotate.field_0.field_0.z = *pfVar3;
    pfVar3 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
    (this->super_xr_bone).m_bind_offset.field_0.field_0.x = *pfVar3;
    pfVar3 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
    (this->super_xr_bone).m_bind_offset.field_0.field_0.y = *pfVar3;
    pfVar3 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
    (this->super_xr_bone).m_bind_offset.field_0.field_0.z = *pfVar3;
    (this->super_xr_bone).m_bind_length = 0.5;
    pfVar3 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
    (this->super_xr_bone).m_mass = *pfVar3;
    pfVar3 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
    (this->super_xr_bone).m_center_of_mass.field_0.field_0.x = *pfVar3;
    pfVar3 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
    (this->super_xr_bone).m_center_of_mass.field_0.field_0.y = *pfVar3;
    pfVar3 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar3 + 1);
    (this->super_xr_bone).m_center_of_mass.field_0.field_0.z = *pfVar3;
    return;
  }
  __assert_fail("m_p <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                ,0x7c,"void xray_re::xr_reader::advance(size_t)");
}

Assistant:

void xr_ogf_v3::bone_io::import_ikdata_0(xr_reader& r)
{
	r.r_sz(m_gamemtl);
	r.r(m_shape);
	r.r(m_joint_ik_data);

	m_joint_ik_data.friction = 0.0f;
	m_joint_ik_data.ik_flags = 0;
	m_joint_ik_data.break_force = 0.0f;
	m_joint_ik_data.break_torque = 0.0f;
	r.advance(-16);

	r.r_fvector3(m_bind_rotate);
	r.r_fvector3(m_bind_offset);

	//std::swap(m_bind_offset.x, m_bind_offset.y);
	//std::swap(m_bind_rotate.x, m_bind_rotate.y);

	m_bind_length = 0.5f;
	m_mass = r.r_float();
	r.r_fvector3(m_center_of_mass);
}